

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_info.c
# Opt level: O0

void amd_l_info(c_float *Info)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *in_RDI;
  c_float lnzd;
  c_float lnz;
  c_float nmultsubs_lu;
  c_float nmultsubs_ldl;
  c_float ndiv;
  c_float n;
  double local_40;
  
  if (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0) {
    (*SuiteSparse_config.printf_func)("\nAMD version %d.%d.%d, %s, results:\n",2,4,6,"May 4, 2016");
  }
  if (in_RDI != (double *)0x0) {
    dVar1 = in_RDI[1];
    dVar2 = in_RDI[10];
    dVar3 = in_RDI[0xb];
    dVar4 = in_RDI[0xc];
    dVar5 = in_RDI[9];
    if ((dVar1 < 0.0) || (dVar5 < 0.0)) {
      local_40 = -1.0;
    }
    else {
      local_40 = dVar1 + dVar5;
    }
    if (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0) {
      (*SuiteSparse_config.printf_func)("    status: ");
    }
    if ((*in_RDI != 0.0) || (NAN(*in_RDI))) {
      if ((*in_RDI != -1.0) || (NAN(*in_RDI))) {
        if ((*in_RDI != -2.0) || (NAN(*in_RDI))) {
          if ((*in_RDI != 1.0) || (NAN(*in_RDI))) {
            if (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0) {
              (*SuiteSparse_config.printf_func)("unknown\n");
            }
          }
          else if (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0) {
            (*SuiteSparse_config.printf_func)("OK, but jumbled\n");
          }
        }
        else if (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0) {
          (*SuiteSparse_config.printf_func)("invalid matrix\n");
        }
      }
      else if (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0) {
        (*SuiteSparse_config.printf_func)("out of memory\n");
      }
    }
    else if (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0) {
      (*SuiteSparse_config.printf_func)("OK\n");
    }
    if ((0.0 <= dVar1) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0)) {
      (*SuiteSparse_config.printf_func)
                ("    n, dimension of A:                                  %.20g\n",dVar1);
    }
    if ((0.0 <= in_RDI[2]) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0))
    {
      (*SuiteSparse_config.printf_func)
                ("    nz, number of nonzeros in A:                        %.20g\n",in_RDI[2]);
    }
    if ((0.0 <= in_RDI[3]) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0))
    {
      (*SuiteSparse_config.printf_func)
                ("    symmetry of A:                                      %.4f\n",in_RDI[3]);
    }
    if ((0.0 <= in_RDI[4]) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0))
    {
      (*SuiteSparse_config.printf_func)
                ("    number of nonzeros on diagonal:                     %.20g\n",in_RDI[4]);
    }
    if ((0.0 <= in_RDI[5]) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0))
    {
      (*SuiteSparse_config.printf_func)
                ("    nonzeros in pattern of A+A\' (excl. diagonal):       %.20g\n",in_RDI[5]);
    }
    if ((0.0 <= in_RDI[6]) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0))
    {
      (*SuiteSparse_config.printf_func)
                ("    # dense rows/columns of A+A\':                       %.20g\n",in_RDI[6]);
    }
    if ((0.0 <= in_RDI[7]) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0))
    {
      (*SuiteSparse_config.printf_func)
                ("    memory used, in bytes:                              %.20g\n",in_RDI[7]);
    }
    if ((0.0 <= in_RDI[8]) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0))
    {
      (*SuiteSparse_config.printf_func)
                ("    # of memory compactions:                            %.20g\n",in_RDI[8]);
    }
    if (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0) {
      (*SuiteSparse_config.printf_func)
                (
                "\n    The following approximate statistics are for a subsequent\n    factorization of A(P,P) + A(P,P)\'.  They are slight upper\n    bounds if there are no dense rows/columns in A+A\', and become\n    looser if dense rows/columns exist.\n\n"
                );
    }
    if ((0.0 <= dVar5) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0)) {
      (*SuiteSparse_config.printf_func)
                ("    nonzeros in L (excluding diagonal):                 %.20g\n",dVar5);
    }
    if ((0.0 <= local_40) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0))
    {
      (*SuiteSparse_config.printf_func)
                ("    nonzeros in L (including diagonal):                 %.20g\n",local_40);
    }
    if ((0.0 <= dVar2) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0)) {
      (*SuiteSparse_config.printf_func)
                ("    # divide operations for LDL\' or LU:                 %.20g\n",dVar2);
    }
    if ((0.0 <= dVar3) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0)) {
      (*SuiteSparse_config.printf_func)
                ("    # multiply-subtract operations for LDL\':            %.20g\n",dVar3);
    }
    if ((0.0 <= dVar4) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0)) {
      (*SuiteSparse_config.printf_func)
                ("    # multiply-subtract operations for LU:              %.20g\n",dVar4);
    }
    if ((0.0 <= in_RDI[0xd]) &&
       (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0)) {
      (*SuiteSparse_config.printf_func)
                ("    max nz. in any column of L (incl. diagonal):        %.20g\n",in_RDI[0xd]);
    }
    if ((((0.0 <= dVar1) && (0.0 <= dVar2)) && (0.0 <= dVar3)) &&
       ((0.0 <= dVar4 && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0)))) {
      (*SuiteSparse_config.printf_func)
                ("\n    chol flop count for real A, sqrt counted as 1 flop: %.20g\n    LDL\' flop count for real A:                         %.20g\n    LDL\' flop count for complex A:                      %.20g\n    LU flop count for real A (with no pivoting):        %.20g\n    LU flop count for complex A (with no pivoting):     %.20g\n\n"
                 ,dVar3 + dVar3 + dVar1 + dVar2,dVar3 + dVar3 + dVar2,dVar2 * 9.0 + dVar3 * 8.0,
                 dVar4 + dVar4 + dVar2,dVar2 * 9.0 + dVar4 * 8.0);
    }
  }
  return;
}

Assistant:

GLOBAL void AMD_info
(
    c_float Info [ ]
)
{
    c_float n, ndiv, nmultsubs_ldl, nmultsubs_lu, lnz, lnzd ;

    SUITESPARSE_PRINTF (("\nAMD version %d.%d.%d, %s, results:\n",
	AMD_MAIN_VERSION, AMD_SUB_VERSION, AMD_SUBSUB_VERSION, AMD_DATE)) ;

    if (!Info)
    {
	return ;
    }

    n = Info [AMD_N] ;
    ndiv = Info [AMD_NDIV] ;
    nmultsubs_ldl = Info [AMD_NMULTSUBS_LDL] ;
    nmultsubs_lu = Info [AMD_NMULTSUBS_LU] ;
    lnz = Info [AMD_LNZ] ;
    lnzd = (n >= 0 && lnz >= 0) ? (n + lnz) : (-1) ;

    /* AMD return status */
    SUITESPARSE_PRINTF (("    status: ")) ;
    if (Info [AMD_STATUS] == AMD_OK)
    {
	SUITESPARSE_PRINTF (("OK\n")) ;
    }
    else if (Info [AMD_STATUS] == AMD_OUT_OF_MEMORY)
    {
	SUITESPARSE_PRINTF (("out of memory\n")) ;
    }
    else if (Info [AMD_STATUS] == AMD_INVALID)
    {
	SUITESPARSE_PRINTF (("invalid matrix\n")) ;
    }
    else if (Info [AMD_STATUS] == AMD_OK_BUT_JUMBLED)
    {
	SUITESPARSE_PRINTF (("OK, but jumbled\n")) ;
    }
    else
    {
	SUITESPARSE_PRINTF (("unknown\n")) ;
    }

    /* statistics about the input matrix */
    PRI ("    n, dimension of A:                                  %.20g\n", n);
    PRI ("    nz, number of nonzeros in A:                        %.20g\n",
	Info [AMD_NZ]) ;
    PRI ("    symmetry of A:                                      %.4f\n",
	Info [AMD_SYMMETRY]) ;
    PRI ("    number of nonzeros on diagonal:                     %.20g\n",
	Info [AMD_NZDIAG]) ;
    PRI ("    nonzeros in pattern of A+A' (excl. diagonal):       %.20g\n",
	Info [AMD_NZ_A_PLUS_AT]) ;
    PRI ("    # dense rows/columns of A+A':                       %.20g\n",
	Info [AMD_NDENSE]) ;

    /* statistics about AMD's behavior  */
    PRI ("    memory used, in bytes:                              %.20g\n",
	Info [AMD_MEMORY]) ;
    PRI ("    # of memory compactions:                            %.20g\n",
	Info [AMD_NCMPA]) ;

    /* statistics about the ordering quality */
    SUITESPARSE_PRINTF (("\n"
	"    The following approximate statistics are for a subsequent\n"
	"    factorization of A(P,P) + A(P,P)'.  They are slight upper\n"
	"    bounds if there are no dense rows/columns in A+A', and become\n"
	"    looser if dense rows/columns exist.\n\n")) ;

    PRI ("    nonzeros in L (excluding diagonal):                 %.20g\n",
	lnz) ;
    PRI ("    nonzeros in L (including diagonal):                 %.20g\n",
	lnzd) ;
    PRI ("    # divide operations for LDL' or LU:                 %.20g\n",
	ndiv) ;
    PRI ("    # multiply-subtract operations for LDL':            %.20g\n",
	nmultsubs_ldl) ;
    PRI ("    # multiply-subtract operations for LU:              %.20g\n",
	nmultsubs_lu) ;
    PRI ("    max nz. in any column of L (incl. diagonal):        %.20g\n",
	Info [AMD_DMAX]) ;

    /* total flop counts for various factorizations */

    if (n >= 0 && ndiv >= 0 && nmultsubs_ldl >= 0 && nmultsubs_lu >= 0)
    {
	SUITESPARSE_PRINTF (("\n"
	"    chol flop count for real A, sqrt counted as 1 flop: %.20g\n"
	"    LDL' flop count for real A:                         %.20g\n"
	"    LDL' flop count for complex A:                      %.20g\n"
	"    LU flop count for real A (with no pivoting):        %.20g\n"
	"    LU flop count for complex A (with no pivoting):     %.20g\n\n",
	n + ndiv + 2*nmultsubs_ldl,
	    ndiv + 2*nmultsubs_ldl,
	  9*ndiv + 8*nmultsubs_ldl,
	    ndiv + 2*nmultsubs_lu,
	  9*ndiv + 8*nmultsubs_lu)) ;
    }
}